

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O1

void QtDebugUtils::formatQEnum<QSwipeGesture::SwipeDirection>(QDebug *debug,SwipeDirection value)

{
  char *pcVar1;
  QTextStream *this;
  long lVar2;
  storage_type *psVar3;
  Stream *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined1 local_58 [24];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::indexOfEnumerator((char *)&QSwipeGesture::staticMetaObject);
  local_58._0_16_ = QMetaObject::enumerator(0x7f4400);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_58);
  this = (QTextStream *)debug->stream;
  if (lVar2 == 0) {
    QTextStream::operator<<(this,value);
    this_00 = debug->stream;
    if (this_00[0x30] != (Stream)0x1) goto LAB_002ced56;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar3 + lVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(this,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    this_00 = debug->stream;
    if (this_00[0x30] == (Stream)0x0) goto LAB_002ced56;
  }
  QTextStream::operator<<((QTextStream *)this_00,' ');
LAB_002ced56:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}